

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_27f4c0::PeerManagerImpl::ProcessValidTx
          (PeerManagerImpl *this,NodeId nodeid,CTransactionRef *tx,
          list<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
          *replaced_transactions)

{
  element_type *peVar1;
  bool bVar2;
  Logger *this_00;
  size_t sVar3;
  const_iterator __end1;
  _List_node_base *p_Var4;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view source_file;
  ulong local_90;
  unsigned_long local_88;
  NodeId nodeid_local;
  string local_78;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  nodeid_local = nodeid;
  TxRequestTracker::ForgetTxHash
            (&this->m_txrequest,
             &(((tx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
              hash).m_wrapped);
  TxRequestTracker::ForgetTxHash
            (&this->m_txrequest,
             &(((tx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
              m_witness_hash).m_wrapped);
  TxOrphanage::AddChildrenToWorkSet
            (&this->m_orphanage,
             (tx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  TxOrphanage::EraseTx
            (&this->m_orphanage,
             &((tx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
              m_witness_hash);
  this_00 = LogInstance();
  bVar2 = BCLog::Logger::WillLogCategoryLevel(this_00,MEMPOOL,Debug);
  if (bVar2) {
    base_blob<256u>::ToString_abi_cxx11_
              (&local_58,
               &((tx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                hash);
    base_blob<256u>::ToString_abi_cxx11_
              (&local_78,
               &((tx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                m_witness_hash);
    local_88 = CTxMemPool::size(this->m_mempool);
    sVar3 = CTxMemPool::DynamicMemoryUsage(this->m_mempool);
    local_90 = sVar3 / 1000;
    logging_function._M_str = "ProcessValidTx";
    logging_function._M_len = 0xe;
    source_file._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
    ;
    source_file._M_len = 0x62;
    LogPrintFormatInternal<long,std::__cxx11::string,std::__cxx11::string,unsigned_long,unsigned_long>
              (logging_function,source_file,0xcd7,MEMPOOL,Debug,(ConstevalFormatString<5U>)0x7d5c0e,
               &nodeid_local,&local_58,&local_78,&local_88,&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
  }
  peVar1 = (tx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  RelayTransaction(this,&(peVar1->hash).m_wrapped,&(peVar1->m_witness_hash).m_wrapped);
  for (p_Var4 = (replaced_transactions->
                super__List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                )._M_impl._M_node.super__List_node_base._M_next;
      p_Var4 != (_List_node_base *)replaced_transactions;
      p_Var4 = (((_List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  *)&p_Var4->_M_next)->_M_impl)._M_node.super__List_node_base._M_next) {
    AddToCompactExtraTransactions(this,(CTransactionRef *)(p_Var4 + 1));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void PeerManagerImpl::ProcessValidTx(NodeId nodeid, const CTransactionRef& tx, const std::list<CTransactionRef>& replaced_transactions)
{
    AssertLockNotHeld(m_peer_mutex);
    AssertLockHeld(g_msgproc_mutex);
    AssertLockHeld(m_tx_download_mutex);

    // As this version of the transaction was acceptable, we can forget about any requests for it.
    // No-op if the tx is not in txrequest.
    m_txrequest.ForgetTxHash(tx->GetHash());
    m_txrequest.ForgetTxHash(tx->GetWitnessHash());

    m_orphanage.AddChildrenToWorkSet(*tx);
    // If it came from the orphanage, remove it. No-op if the tx is not in txorphanage.
    m_orphanage.EraseTx(tx->GetWitnessHash());

    LogDebug(BCLog::MEMPOOL, "AcceptToMemoryPool: peer=%d: accepted %s (wtxid=%s) (poolsz %u txn, %u kB)\n",
             nodeid,
             tx->GetHash().ToString(),
             tx->GetWitnessHash().ToString(),
             m_mempool.size(), m_mempool.DynamicMemoryUsage() / 1000);

    RelayTransaction(tx->GetHash(), tx->GetWitnessHash());

    for (const CTransactionRef& removedTx : replaced_transactions) {
        AddToCompactExtraTransactions(removedTx);
    }
}